

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O2

Hop_Obj_t * Hop_ObjChild1Copy(Hop_Obj_t *pObj)

{
  ulong *puVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hop.h"
                  ,0xbb,"Hop_Obj_t *Hop_ObjChild1Copy(Hop_Obj_t *)");
  }
  puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
  if (puVar1 != (ulong *)0x0) {
    return (Hop_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
  }
  return (Hop_Obj_t *)0x0;
}

Assistant:

static inline Hop_Obj_t *  Hop_ObjChild1Copy( Hop_Obj_t * pObj )  { assert( !Hop_IsComplement(pObj) ); return Hop_ObjFanin1(pObj)? Hop_NotCond((Hop_Obj_t *)Hop_ObjFanin1(pObj)->pData, Hop_ObjFaninC1(pObj)) : NULL;  }